

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leds.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  bool local_231;
  uchar local_223;
  uchar local_222;
  uchar local_221;
  int local_220;
  int local_21c;
  int i;
  int len;
  byte local_210;
  byte local_20f;
  char digit_buffer [5];
  uint8_t power_led;
  bool enable_spot_led;
  bool enable_dock_led;
  bool enable_debris_led;
  bool enable_check_robot_led;
  Create local_1e8 [8];
  Create robot;
  allocator local_91;
  string local_90 [32];
  undefined4 local_70;
  int baud;
  allocator local_59;
  string local_58 [8];
  string port;
  RobotModel model;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"/dev/ttyUSB0",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_70 = 0x1c200;
  local_231 = false;
  if (1 < argc) {
    pcVar3 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar3,&local_91);
    local_231 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"create1");
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if (local_231 == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Running driver for Create 2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_70 = 0xe100;
    poVar2 = std::operator<<((ostream *)&std::cout,"Running driver for Create 1");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  create::Create::Create(local_1e8,1);
  bVar1 = create::Create::connect((string *)local_1e8,(int *)local_58);
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    create::Create::~Create(local_1e8);
    std::__cxx11::string::~string(local_58);
    return 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  stack0xfffffffffffffdf4 = 3;
  create::Create::setMode((CreateMode *)local_1e8);
  digit_buffer[1] = '\x01';
  digit_buffer[0] = '\0';
  local_20f = 1;
  local_210 = 0;
  len._3_1_ = 0;
  do {
    create::Create::enableCheckRobotLED((bool *)local_1e8);
    create::Create::enableDebrisLED((bool *)local_1e8);
    create::Create::enableDockLED((bool *)local_1e8);
    create::Create::enableSpotLED((bool *)local_1e8);
    i._1_1_ = 0xff;
    create::Create::setPowerLED((uchar *)local_1e8,(uchar *)((long)&len + 3));
    local_21c = sprintf((char *)((long)&i + 2),"%d",(ulong)len._3_1_);
    for (local_220 = local_21c; local_220 < 4; local_220 = local_220 + 1) {
      *(undefined1 *)((long)&i + (long)local_220 + 2) = 0x20;
    }
    local_221 = i._2_1_;
    local_222 = i._3_1_;
    local_223 = (uchar)len;
    create::Create::setDigitsASCII((uchar *)local_1e8,&local_221,&local_222,&local_223);
    digit_buffer[1] = ~digit_buffer[1] & 1;
    digit_buffer[0] = ~digit_buffer[0] & 1;
    local_20f = ~local_20f & 1;
    local_210 = ~local_210 & 1;
    len._3_1_ = len._3_1_ + 1;
    usleep(250000);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  bool enable_check_robot_led = true;
  bool enable_debris_led = false;
  bool enable_dock_led = true;
  bool enable_spot_led = false;
  uint8_t power_led = 0;
  char digit_buffer[5];

  while (true) {
    // Set LEDs
    robot.enableCheckRobotLED(enable_check_robot_led);
    robot.enableDebrisLED(enable_debris_led);
    robot.enableDockLED(enable_dock_led);
    robot.enableSpotLED(enable_spot_led);
    robot.setPowerLED(power_led);

    // Set 7-segment displays
    const int len = sprintf(digit_buffer, "%d", power_led);
    for (int i = len; i < 4; i++) digit_buffer[i] = ' ';
    robot.setDigitsASCII(digit_buffer[0], digit_buffer[1], digit_buffer[2], digit_buffer[3]);

    // Update LED values
    enable_check_robot_led = !enable_check_robot_led;
    enable_debris_led = !enable_debris_led;
    enable_dock_led = !enable_dock_led;
    enable_spot_led = !enable_spot_led;
    power_led++;

    usleep(250000);  // 5 Hz
  }

  return 0;
}